

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

BOOL __thiscall
Js::DiagScopeVariablesWalker::Get
          (DiagScopeVariablesWalker *this,int i,ResolvedObject *pResolvedObject)

{
  Type pIVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  Type *ppIVar6;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  int iVar7;
  
  if (((-1 < i) && (i < (int)this->diagScopeVarCount)) &&
     (this_00 = this->pDiagScopeObjects,
     0 < (this_00->
         super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
         ).count)) {
    iVar7 = 0;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      ppIVar6 = JsUtil::
                List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(this_00,iVar7);
      pIVar1 = *ppIVar6;
      iVar4 = (*pIVar1->_vptr_IDiagObjectModelWalkerBase[1])(pIVar1);
      if (i < iVar4) {
        iVar7 = (**pIVar1->_vptr_IDiagObjectModelWalkerBase)(pIVar1,(ulong)(uint)i,pResolvedObject);
        return iVar7;
      }
      iVar4 = (*pIVar1->_vptr_IDiagObjectModelWalkerBase[1])(pIVar1);
      i = i - iVar4;
      if (i < 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x405,"(i >=0)","i >=0");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      iVar7 = iVar7 + 1;
      this_00 = this->pDiagScopeObjects;
    } while (iVar7 < (this_00->
                     super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                     ).count);
  }
  return 0;
}

Assistant:

BOOL DiagScopeVariablesWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        if (i >= 0 && i < (int)diagScopeVarCount)
        {
            for (int j = 0; j < pDiagScopeObjects->Count(); j++)
            {
                IDiagObjectModelWalkerBase *pObjWalker = pDiagScopeObjects->Item(j);
                if (i < (int)pObjWalker->GetChildrenCount())
                {
                    return pObjWalker->Get(i, pResolvedObject);
                }
                i -= (int)pObjWalker->GetChildrenCount();
                Assert(i >=0);
            }
        }

        return FALSE;
    }